

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

IStream * Catch::makeStream(StringRef *filename)

{
  char cVar1;
  bool bVar2;
  IStream *pIVar3;
  streambuf *this;
  char *pcVar4;
  IStream *this_00;
  string local_60;
  ReusableStringStream local_40;
  StringRef local_28;
  
  if (filename->m_size == 0) {
    pIVar3 = (IStream *)operator_new(0x118);
    pIVar3->_vptr_IStream = (_func_int **)&PTR__CoutStream_00183838;
    std::ostream::ostream
              (pIVar3 + 1,*(streambuf **)(__cxa_end_catch + *(long *)(std::cout + -0x18)));
  }
  else {
    cVar1 = StringRef::operator[](filename,0);
    if (cVar1 == '%') {
      local_60._M_dataplus._M_p = "%debug";
      local_60._M_string_length = 6;
      bVar2 = StringRef::operator==(filename,(StringRef *)&local_60);
      if (!bVar2) {
        ReusableStringStream::ReusableStringStream(&local_40);
        std::operator<<(local_40.m_oss,"Unrecognised stream: \'");
        operator<<(local_40.m_oss,filename);
        std::operator<<(local_40.m_oss,"\'");
        std::__cxx11::stringbuf::str();
        throw_domain_error(&local_60);
      }
      pIVar3 = (IStream *)operator_new(0x120);
      pIVar3->_vptr_IStream = (_func_int **)&PTR__DebugOutStream_00183878;
      this = (streambuf *)operator_new(0x148);
      std::streambuf::streambuf(this);
      *(undefined ***)this = &PTR__StreamBufImpl_001838b8;
      *(streambuf **)(this + 0x28) = this + 0x40;
      *(streambuf **)(this + 0x20) = this + 0x40;
      *(streambuf **)(this + 0x30) = this + 0x140;
      pIVar3[1]._vptr_IStream = (_func_int **)this;
      std::ostream::ostream(pIVar3 + 2,this);
    }
    else {
      pIVar3 = (IStream *)operator_new(0x208);
      local_28.m_start = filename->m_start;
      local_28.m_size = filename->m_size;
      pIVar3->_vptr_IStream = (_func_int **)&PTR__FileStream_00183950;
      this_00 = pIVar3 + 1;
      std::ofstream::ofstream(this_00);
      pcVar4 = StringRef::c_str(&local_28);
      std::ofstream::open((char *)this_00,(_Ios_Openmode)pcVar4);
      if (((byte)this_00->_vptr_IStream[-3][(long)&pIVar3[5]._vptr_IStream] & 5) != 0) {
        ReusableStringStream::ReusableStringStream(&local_40);
        std::operator<<(local_40.m_oss,"Unable to open file: \'");
        operator<<(local_40.m_oss,&local_28);
        std::operator<<(local_40.m_oss,"\'");
        std::__cxx11::stringbuf::str();
        throw_domain_error(&local_60);
      }
    }
  }
  return pIVar3;
}

Assistant:

constexpr auto empty() const noexcept -> bool {
            return m_size == 0;
        }